

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PClass * __thiscall PClass::CreateDerivedClass(PClass *this,FName *name,uint size)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  PClass *pPVar7;
  PClassActor *local_58;
  uint local_50;
  FName local_4c;
  uint index;
  PClass *existclass;
  size_t bucket;
  PClass *pPStack_30;
  bool notnew;
  PClass *type;
  FName *pFStack_20;
  uint size_local;
  FName *name_local;
  PClass *this_local;
  
  pPVar7 = RegistrationInfo.MyClass;
  type._4_4_ = size;
  pFStack_20 = name;
  name_local = (FName *)this;
  if (size < *(uint *)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.
                       super_PCompoundType.super_PType.super_PTypeBase.super_DObject.field_0x24) {
    __assert_fail("size >= Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                  ,0xccf,"PClass *PClass::CreateDerivedClass(FName, unsigned int)");
  }
  iVar2 = FName::operator_cast_to_int(name);
  _index = (PClassActor *)
           FTypeTable::FindType(&TypeTable,pPVar7,0,(long)iVar2,(size_t *)&existclass);
  if (_index == (PClassActor *)0x0) {
    bucket._7_1_ = 0;
  }
  else {
    if (*(int *)&(_index->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                 super_PCompoundType.super_PType.super_PTypeBase.super_DObject.field_0x24 != -1) {
      return (PClass *)0x0;
    }
    bVar1 = IsDescendantOf(this,(_index->super_PClass).ParentClass);
    if (!bVar1) {
      pcVar5 = FName::GetChars(name);
      pcVar6 = FName::GetChars(&(((_index->super_PClass).ParentClass)->super_PNativeStruct).
                                super_PStruct.super_PNamedType.TypeName);
      I_Error("%s must inherit from %s but doesn\'t.",pcVar5,pcVar6);
    }
    if ((type._4_4_ == 0xffffffff) && (this == (_index->super_PClass).ParentClass)) {
      (_index->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
      super_PType.super_PTypeBase.super_DObject.ObjectFlags =
           (_index->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
           super_PCompoundType.super_PType.super_PTypeBase.super_DObject.ObjectFlags & 0x800;
      return &_index->super_PClass;
    }
    bucket._7_1_ = 1;
  }
  pPVar7 = (PClass *)GetClass(this);
  pPVar7 = (PClass *)CreateNew(pPVar7);
  pPStack_30 = pPVar7;
  FName::FName(&local_4c,name);
  Derive(this,pPVar7,&local_4c);
  *(uint *)&(pPStack_30->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
            super_PType.super_PTypeBase.super_DObject.field_0x24 = type._4_4_;
  if (type._4_4_ != 0xffffffff) {
    InitializeDefaults(pPStack_30);
    TArray<VMFunction_*,_VMFunction_*>::operator=(&pPStack_30->Virtuals,&this->Virtuals);
    (**(code **)(*(long *)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.
                           super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0xb8))
              (this,pPStack_30);
  }
  if ((bucket._7_1_ & 1) == 0) {
    InsertIntoHash(pPStack_30);
  }
  else {
    FTypeTable::ReplaceType(&TypeTable,(PType *)pPStack_30,(PType *)_index,(size_t)existclass);
    DObject::StaticPointerSubstitution((DObject *)_index,(DObject *)pPStack_30,true);
    local_58 = _index;
    uVar3 = TArray<PClassActor_*,_PClassActor_*>::Find(&PClassActor::AllActorClasses,&local_58);
    local_50 = uVar3;
    uVar4 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses);
    if (uVar3 < uVar4) {
      TArray<PClassActor_*,_PClassActor_*>::Delete(&PClassActor::AllActorClasses,local_50);
    }
    uVar3 = TArray<PClass_*,_PClass_*>::Find(&AllClasses,(PClass **)&index);
    local_50 = uVar3;
    uVar4 = TArray<PClass_*,_PClass_*>::Size(&AllClasses);
    if (uVar3 < uVar4) {
      TArray<PClass_*,_PClass_*>::Delete(&AllClasses,local_50);
    }
    (*(_index->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
      super_PType.super_PTypeBase.super_DObject._vptr_DObject[4])();
  }
  return pPStack_30;
}

Assistant:

PClass *PClass::CreateDerivedClass(FName name, unsigned int size)
{
	assert (size >= Size);
	PClass *type;
	bool notnew;
	size_t bucket;

	PClass *existclass = static_cast<PClass *>(TypeTable.FindType(RUNTIME_CLASS(PClass), /*FIXME:Outer*/0, name, &bucket));

	// This is a placeholder so fill it in
	if (existclass != nullptr)
	{
		if (existclass->Size == TentativeClass)
		{
			if (!IsDescendantOf(existclass->ParentClass))
			{
				I_Error("%s must inherit from %s but doesn't.", name.GetChars(), existclass->ParentClass->TypeName.GetChars());
			}

			if (size == TentativeClass)
			{
				// see if we can reuse the existing class. This is only possible if the inheritance is identical. Otherwise it needs to be replaced.
				if (this == existclass->ParentClass)
				{
					existclass->ObjectFlags &= OF_Transient;
					return existclass;
				}
			}
			notnew = true;
		}
		else
		{
			// a different class with the same name already exists. Let the calling code deal with this.
			return nullptr;
		}
	}
	else
	{
		notnew = false;
	}

	// Create a new type object of the same type as us. (We may be a derived class of PClass.)
	type = static_cast<PClass *>(GetClass()->CreateNew());

	Derive(type, name);
	type->Size = size;
	if (size != TentativeClass)
	{
		type->InitializeDefaults();
		type->Virtuals = Virtuals;
		DeriveData(type);
	}
	if (!notnew)
	{
		type->InsertIntoHash();
	}
	else
	{
		TypeTable.ReplaceType(type, existclass, bucket);
		StaticPointerSubstitution(existclass, type, true);	// replace the old one, also in the actor defaults.
		// Delete the old class from the class lists, both the full one and the actor list.
		auto index = PClassActor::AllActorClasses.Find(static_cast<PClassActor*>(existclass));
		if (index < PClassActor::AllActorClasses.Size()) PClassActor::AllActorClasses.Delete(index);
		index = PClass::AllClasses.Find(existclass);
		if (index < PClass::AllClasses.Size()) PClass::AllClasses.Delete(index);
		// Now we can destroy the old class as nothing should reference it anymore
		existclass->Destroy();
	}
	return type;
}